

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleFile.cpp
# Opt level: O0

QString * __thiscall
ModuleFile::crashSave(QString *__return_storage_ptr__,ModuleFile *this,Module *mod)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  FormatError FVar4;
  Module *this_00;
  string local_380;
  ostream local_360 [8];
  ofstream stream;
  QLatin1Char local_15b;
  QChar local_15a;
  undefined8 local_158;
  QArrayDataPointer<char16_t> local_150;
  QString local_138;
  QDateTime local_120 [8];
  QString local_118;
  QArrayDataPointer<char16_t> local_100;
  QString local_e8;
  QString local_d0;
  QString local_b8;
  QDir local_a0 [8];
  QString local_98;
  QFileInfo local_70 [8];
  QFileInfo info;
  QString copyPath;
  Module *mod_local;
  ModuleFile *this_local;
  char16_t *str;
  char16_t *str_1;
  
  QString::QString((QString *)&info);
  bVar1 = hasFile(this);
  if (bVar1) {
    QFileInfo::QFileInfo(local_70,(QString *)&this->mFilepath);
    QFileInfo::dir();
    QFileInfo::baseName();
    QDir::filePath((QString *)&local_98);
    QString::operator=((QString *)&info,&local_98);
    QString::~QString(&local_98);
    QString::~QString(&local_b8);
    QDir::~QDir(local_a0);
    QFileInfo::~QFileInfo(local_70);
  }
  else {
    QString::operator=((QString *)&info,(QString *)this);
  }
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_100,(Data *)0x0,L".crash-%1.tbm",0xd);
  QString::QString(&local_e8,&local_100);
  QDateTime::currentDateTime();
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_150,(Data *)0x0,L"yyyy.mm.ddThh.mm.ss",0x13)
  ;
  QString::QString(&local_138,&local_150);
  QCalendar::QCalendar((QCalendar *)&local_158);
  QDateTime::toString(&local_118,local_120,&local_138,local_158);
  QLatin1Char::QLatin1Char(&local_15b,' ');
  QChar::QChar(&local_15a,local_15b);
  QString::arg((QString *)&local_d0,(int)&local_e8,(QChar *)&local_118);
  QString::append((QString *)&info);
  QString::~QString(&local_d0);
  QString::~QString(&local_118);
  QString::~QString(&local_138);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_150);
  QDateTime::~QDateTime(local_120);
  QString::~QString(&local_e8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_100);
  QString::toStdString_abi_cxx11_(&local_380,(QString *)&info);
  _Var3 = std::operator|(_S_bin,_S_out);
  std::ofstream::ofstream(local_360,(string *)&local_380,_Var3);
  std::__cxx11::string::~string((string *)&local_380);
  bVar2 = std::ios::good();
  if ((bVar2 & 1) != 0) {
    Module::beginSave(mod);
    this_00 = Module::data(mod);
    FVar4 = trackerboy::Module::serialize(this_00,local_360);
    if (FVar4 == none) {
      QString::QString(__return_storage_ptr__,(QString *)&info);
      goto LAB_0017b9fa;
    }
  }
  QString::QString(__return_storage_ptr__);
LAB_0017b9fa:
  std::ofstream::~ofstream(local_360);
  QString::~QString((QString *)&info);
  return __return_storage_ptr__;
}

Assistant:

QString ModuleFile::crashSave(Module &mod) {
    // attempt to save a copy of the module
    // the copy is the same path of the module, but with .crash-%1 appended
    // where %1 is an ISO 8601 timestamp
    QString copyPath;
    if (hasFile()) {
        QFileInfo info(mFilepath);
        copyPath = info.dir().filePath(info.baseName());
    } else {
        copyPath = mFilename;
    }
    copyPath.append(QStringLiteral(".crash-%1.tbm").arg(
        QDateTime::currentDateTime().toString(QStringLiteral("yyyy.mm.ddThh.mm.ss"))
    ));

    // This approach uses the same directory as the module file, which will
    // fail if we don't have write permissions in this directory. Might be worth
    // checking beforehand and use a fall-back location if this is the case
    // (perhaps the user's home directory)

    // for modules without a path, the file gets saved in the current directory

    // in the case of collisions, the file will be overwritten. Should be
    // extremely unlikely due to the timestamp being added to the filename

    std::ofstream stream(copyPath.toStdString(), std::ios::binary | std::ios::out);
    if (stream.good()) {
        mod.beginSave();
        if (mod.data().serialize(stream) == trackerboy::FormatError::none) {
            // success! return the path of the saved file
            return copyPath;
        }
    }

    // we either could not open the stream or an error occurred during serialization
    return {};
}